

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O0

tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
binary::uvarint_abi_cxx11_
          (tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,binary *this,Bytes *buf)

{
  allocator<unsigned_char> local_69;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  int local_38 [2];
  __tuple_element_t<1UL,_tuple<unsigned_int,_int>_> *local_30;
  type_conflict *c;
  type *n;
  binary *local_18;
  Bytes *buf_local;
  
  local_18 = this;
  buf_local = (Bytes *)__return_storage_ptr__;
  binUvarint((binary *)&n,(Bytes *)this);
  c = (type_conflict *)std::get<0ul,unsigned_int,int>((tuple<unsigned_int,_int> *)&n);
  local_30 = std::get<1ul,unsigned_int,int>((tuple<unsigned_int,_int> *)&n);
  if (*local_30 == 0) {
    local_38[1] = 0;
    std::
    tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    tuple<int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (__return_storage_ptr__,local_38 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               multihash::errVarIntBufferTooShort_abi_cxx11_);
  }
  else if (*local_30 < 0) {
    local_38[0] = 0;
    std::
    tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    tuple<int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (__return_storage_ptr__,local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               multihash::errVarIntTooLong_abi_cxx11_);
  }
  else {
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18);
    local_58 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_60,(long)*local_30);
    local_68._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18);
    std::allocator<unsigned_char>::allocator(&local_69);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,local_58,local_68,
               &local_69);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18,&local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_50);
    std::allocator<unsigned_char>::~allocator(&local_69);
    std::
    tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::tuple<unsigned_int_&,_const_std::nullopt_t_&,_true>
              (__return_storage_ptr__,(uint *)c,(nullopt_t *)&std::nullopt);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<UInt, OptError> uvarint(Bytes &buf) {
	auto [n, c] = binUvarint(buf);
	if (c == 0) {
		return {0, errVarIntBufferTooShort};
	}
	if (c < 0) {
		return {0, errVarIntTooLong};
	}
	buf = Bytes{buf.begin() + c, buf.end()};
	return {n, std::nullopt};
}